

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::CollationSettings::setFlag
          (CollationSettings *this,int32_t bit,UColAttributeValue value,int32_t defaultOptions,
          UErrorCode *errorCode)

{
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if (value == UCOL_DEFAULT) {
    this->options = (defaultOptions ^ this->options) & bit ^ this->options;
    return;
  }
  if (value == UCOL_OFF) {
    this->options = this->options & ~bit;
    return;
  }
  if (value == UCOL_ON) {
    this->options = this->options | bit;
    return;
  }
  *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }